

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *poVar2;
  char cVar3;
  int iVar4;
  bool _printInfoMessages;
  AssertionPrinter printer;
  AssertionPrinter local_c0;
  
  iVar4 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[7])();
  _printInfoMessages = true;
  if (((char)iVar4 == '\0') &&
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (_printInfoMessages = false, OVar1 != Warning)))) {
    return false;
  }
  lazyPrint(this);
  AssertionPrinter::AssertionPrinter
            (&local_c0,(this->super_StreamingReporterBase).stream,_assertionStats,_printInfoMessages
            );
  AssertionPrinter::print(&local_c0);
  poVar2 = (this->super_StreamingReporterBase).stream;
  cVar3 = (char)poVar2;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&local_c0.messages);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.message._M_dataplus._M_p != &local_c0.message.field_2) {
    operator_delete(local_c0.message._M_dataplus._M_p,
                    local_c0.message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.messageLabel._M_dataplus._M_p != &local_c0.messageLabel.field_2) {
    operator_delete(local_c0.messageLabel._M_dataplus._M_p,
                    local_c0.messageLabel.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.passOrFail._M_dataplus._M_p != &local_c0.passOrFail.field_2) {
    operator_delete(local_c0.passOrFail._M_dataplus._M_p,
                    local_c0.passOrFail.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) CATCH_OVERRIDE {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            lazyPrint();

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();
            stream << std::endl;
            return true;
        }